

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O2

void __thiscall Simplex::checkBasis(Simplex *this)

{
  longdouble *a;
  ulong uVar1;
  int i;
  ulong uVar2;
  int j;
  ulong uVar3;
  long lVar4;
  longdouble lVar5;
  
  fwrite("Check basis:\n",0xd,1,_stderr);
  lVar4 = (long)this->m;
  uVar2 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar2 = lVar4 << 4;
  }
  a = (longdouble *)operator_new__(uVar2);
  for (uVar2 = 0; (long)uVar2 < (long)(int)lVar4; uVar2 = uVar2 + 1) {
    calcBInvRow(this,a,(int)uVar2);
    uVar3 = 0;
    while( true ) {
      lVar5 = (longdouble)0;
      lVar4 = (long)this->m;
      if (lVar4 <= (long)uVar3) break;
      uVar1 = (ulong)(uint)this->AV_nz[this->rtoc[uVar3]];
      if (this->AV_nz[this->rtoc[uVar3]] < 1) {
        uVar1 = 0;
      }
      for (lVar4 = 0; uVar1 * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
        lVar5 = *(longdouble *)((long)&this->AV[this->rtoc[uVar3]]->field_0 + lVar4) *
                a[*(int *)((long)&this->AV[this->rtoc[uVar3]]->field_0 + lVar4 + 0xc)] + lVar5;
      }
      if (uVar2 == uVar3) {
        lVar5 = lVar5 + -(longdouble)1;
      }
      if ((longdouble)1e-06 <= ABS(lVar5)) {
        fprintf(_stderr,"%d:%d:%.2Lf ",uVar2 & 0xffffffff,uVar3 & 0xffffffff);
      }
      uVar3 = uVar3 + 1;
    }
  }
  operator_delete__(a);
  return;
}

Assistant:

void Simplex::checkBasis() {
	//	printTableau(true);
	fprintf(stderr, "Check basis:\n");
	//	long double temp[m];
	auto* temp = new long double[m];
	for (int i = 0; i < m; i++) {
		calcBInvRow(temp, i);
		for (int j = 0; j < m; j++) {
			long double sum = 0;
			for (int k = 0; k < AV_nz[rtoc[j]]; k++) {
				sum += temp[AV[rtoc[j]][k].index()] * AV[rtoc[j]][k].val();
			}
			if (i == j) {
				sum -= 1;
			}
			if (!almostZero6(sum)) {
				fprintf(stderr, "%d:%d:%.2Lf ", i, j, sum);
			}
			assert(almostZero6(sum));
		}
		//		fprintf(stderr, "\n");
	}
	delete[] temp;
}